

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O2

void load_pixel_w4(uint8_t *above,uint8_t *left,int height,__m128i *pixels)

{
  undefined4 uVar1;
  __m128i alVar2;
  __m128i alVar3;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar4 [16];
  
  uVar1 = *(undefined4 *)above;
  if (height == 8) {
    alVar2[1] = 0;
    alVar2[0] = *(ulong *)left;
  }
  else if (height == 4) {
    alVar2 = (__m128i)ZEXT416(*(uint *)left);
  }
  else {
    alVar2 = *(__m128i *)left;
  }
  pixels[1] = alVar2;
  auVar6 = pshuflw(ZEXT116(above[3]),ZEXT116(above[3]),0);
  uVar5 = auVar6._0_4_;
  *(undefined4 *)pixels[2] = uVar5;
  *(undefined4 *)((long)pixels[2] + 4) = uVar5;
  *(undefined4 *)(pixels[2] + 1) = uVar5;
  *(undefined4 *)((long)pixels[2] + 0xc) = uVar5;
  auVar7 = pshuflw(ZEXT116(left[(long)height + -1]),ZEXT116(left[(long)height + -1]),0);
  alVar3[0]._0_2_ = (ushort)(byte)uVar1;
  auVar4._0_12_ = ZEXT712(0);
  auVar4[0xc] = (char)((uint)uVar1 >> 0x18);
  auVar4[0xd] = 0;
  auVar4._14_2_ = auVar7._6_2_;
  auVar6._12_4_ = auVar4._12_4_;
  auVar6._0_10_ = (unkuint10)0;
  auVar6._10_2_ = auVar7._4_2_;
  alVar3[1]._2_6_ = auVar6._10_6_;
  alVar3[1]._0_2_ = (ushort)(byte)((uint)uVar1 >> 0x10);
  alVar3[0]._6_2_ = auVar7._2_2_;
  alVar3[0]._4_2_ = (ushort)(byte)((uint)uVar1 >> 8);
  alVar3[0]._2_2_ = auVar7._0_2_;
  *pixels = alVar3;
  return;
}

Assistant:

static inline void load_pixel_w4(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  __m128i d = _mm_cvtsi32_si128(((const int *)above)[0]);
  if (height == 4)
    pixels[1] = _mm_cvtsi32_si128(((const int *)left)[0]);
  else if (height == 8)
    pixels[1] = _mm_loadl_epi64(((const __m128i *)left));
  else
    pixels[1] = _mm_loadu_si128(((const __m128i *)left));

  pixels[2] = _mm_set1_epi16((int16_t)above[3]);

  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  const __m128i zero = _mm_setzero_si128();
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
}